

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlSchemaSetValidErrors(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlSchemaValidCtxtPyCtxtPtr local_60;
  undefined8 *local_58;
  xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
  xmlSchemaValidCtxtPtr ctxt;
  PyObject *pyobj_arg;
  PyObject *pyobj_ctx;
  PyObject *pyobj_warn;
  PyObject *pyobj_error;
  PyObject *py_retval;
  PyObject *args_local;
  PyObject *self_local;
  
  ctxt = (xmlSchemaValidCtxtPtr)&_Py_NoneStruct;
  py_retval = args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT
                    (args,"OOO|O:xmlSchemaSetValidErrors",&pyobj_arg,&pyobj_warn,&pyobj_ctx,&ctxt);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (pyobj_arg == (PyObject *)&_Py_NoneStruct) {
      local_60 = (xmlSchemaValidCtxtPyCtxtPtr)0x0;
    }
    else {
      local_60 = (xmlSchemaValidCtxtPyCtxtPtr)pyobj_arg[1].ob_refcnt;
    }
    pyCtxt = local_60;
    iVar1 = xmlSchemaGetValidErrors(local_60,0,0,&local_58);
    if (iVar1 == -1) {
      self_local = libxml_intWrap(-1);
    }
    else {
      if (local_58 == (undefined8 *)0x0) {
        local_58 = (undefined8 *)(*_xmlMalloc)(0x18);
        if (local_58 == (undefined8 *)0x0) {
          pPVar2 = libxml_intWrap(-1);
          return pPVar2;
        }
        memset(local_58,0,0x18);
      }
      _Py_XDECREF((PyObject *)local_58[1]);
      _Py_XINCREF(pyobj_warn);
      local_58[1] = pyobj_warn;
      _Py_XDECREF((PyObject *)*local_58);
      _Py_XINCREF(pyobj_ctx);
      *local_58 = pyobj_ctx;
      _Py_XDECREF((PyObject *)local_58[2]);
      _Py_XINCREF((PyObject *)ctxt);
      local_58[2] = ctxt;
      xmlSchemaSetValidErrors
                (pyCtxt,libxml_xmlSchemaValidityErrorFunc,libxml_xmlSchemaValidityWarningFunc,
                 local_58);
      self_local = libxml_intWrap(1);
    }
  }
  return self_local;
}

Assistant:

PyObject *
libxml_xmlSchemaSetValidErrors(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
	PyObject *py_retval;
	PyObject *pyobj_error;
	PyObject *pyobj_warn;
	PyObject *pyobj_ctx;
	PyObject *pyobj_arg = Py_None;
	xmlSchemaValidCtxtPtr ctxt;
	xmlSchemaValidCtxtPyCtxtPtr pyCtxt;

	if (!PyArg_ParseTuple
		(args, (char *) "OOO|O:xmlSchemaSetValidErrors", &pyobj_ctx, &pyobj_error, &pyobj_warn, &pyobj_arg))
		return (NULL);

#ifdef DEBUG_ERROR
	printf("libxml_xmlSchemaSetValidErrors(%p, %p, %p) called\n", pyobj_ctx, pyobj_error, pyobj_warn);
#endif

	ctxt = PySchemaValidCtxt_Get(pyobj_ctx);
	if (xmlSchemaGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == -1)
	{
		py_retval = libxml_intWrap(-1);
		return(py_retval);
	}

	if (pyCtxt == NULL)
	{
		/* first time to set the error handlers */
		pyCtxt = xmlMalloc(sizeof(xmlSchemaValidCtxtPyCtxt));
		if (pyCtxt == NULL) {
			py_retval = libxml_intWrap(-1);
			return(py_retval);
		}
		memset(pyCtxt, 0, sizeof(xmlSchemaValidCtxtPyCtxt));
	}

	/* TODO: check warn and error is a function ! */
	Py_XDECREF(pyCtxt->error);
	Py_XINCREF(pyobj_error);
	pyCtxt->error = pyobj_error;

	Py_XDECREF(pyCtxt->warn);
	Py_XINCREF(pyobj_warn);
	pyCtxt->warn = pyobj_warn;

	Py_XDECREF(pyCtxt->arg);
	Py_XINCREF(pyobj_arg);
	pyCtxt->arg = pyobj_arg;

	xmlSchemaSetValidErrors(ctxt, &libxml_xmlSchemaValidityErrorFunc, &libxml_xmlSchemaValidityWarningFunc, pyCtxt);

	py_retval = libxml_intWrap(1);
	return(py_retval);
}